

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int UTF16LEToUTF8(uchar *out,int *outlen,uchar *inb,int *inlenb)

{
  byte *pbVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uchar *processed;
  byte bVar6;
  ushort *puVar7;
  ushort *puVar8;
  uint uVar9;
  byte *pbVar10;
  
  iVar3 = *outlen;
  if ((long)iVar3 == 0) {
    *inlenb = 0;
    return 0;
  }
  if ((*inlenb & 0x80000001U) == 1) {
    *inlenb = *inlenb - 1;
  }
  iVar4 = *inlenb;
  puVar8 = (ushort *)inb;
  pbVar10 = out;
  if (2 < iVar4 + 1U) {
    do {
      if ((long)*outlen <= ((long)pbVar10 - (long)out) + 5) break;
      puVar7 = puVar8 + 1;
      uVar9 = (uint)*puVar8;
      if ((uVar9 & 0xfc00) == 0xd800) {
        if (inb + (ulong)(uint)(iVar4 / 2) * 2 <= puVar7) break;
        uVar2 = *puVar7;
        if ((uVar2 & 0xfc00) != 0xdc00) {
          *outlen = (int)((long)pbVar10 - (long)out);
          *inlenb = (int)puVar8 - (int)inb;
          return -2;
        }
        puVar7 = puVar8 + 2;
        uVar9 = (*puVar8 & 0x3ff) * 0x400 + (uVar2 & 0x3ff) + 0x10000;
      }
      if (out + iVar3 <= pbVar10) break;
      if (uVar9 < 0x80) {
        iVar5 = -6;
        bVar6 = (byte)uVar9;
      }
      else if (uVar9 < 0x800) {
        bVar6 = (byte)(uVar9 >> 6) | 0xc0;
        iVar5 = 0;
      }
      else if (uVar9 < 0x10000) {
        bVar6 = (byte)(uVar9 >> 0xc) | 0xe0;
        iVar5 = 6;
      }
      else {
        bVar6 = (byte)(uVar9 >> 0x12) | 0xf0;
        iVar5 = 0xc;
      }
      pbVar1 = pbVar10 + 1;
      *pbVar10 = bVar6;
      pbVar10 = pbVar1;
      if (0x7f < uVar9) {
        while (pbVar10 < out + iVar3) {
          *pbVar10 = (byte)(uVar9 >> ((byte)iVar5 & 0x1f)) & 0x3f | 0x80;
          pbVar10 = pbVar10 + 1;
          if (iVar5 < 6) break;
          iVar5 = iVar5 + -6;
        }
      }
      puVar8 = puVar7;
    } while (puVar7 < inb + (ulong)(uint)(iVar4 / 2) * 2);
  }
  *outlen = (int)pbVar10 - (int)out;
  *inlenb = (int)puVar8 - (int)inb;
  return *outlen;
}

Assistant:

static int
UTF16LEToUTF8(unsigned char* out, int *outlen,
            const unsigned char* inb, int *inlenb)
{
    unsigned char* outstart = out;
    const unsigned char* processed = inb;
    unsigned char* outend;
    unsigned short* in = (unsigned short*) inb;
    unsigned short* inend;
    unsigned int c, d, inlen;
    unsigned char *tmp;
    int bits;

    if (*outlen == 0) {
        *inlenb = 0;
        return(0);
    }
    outend = out + *outlen;
    if ((*inlenb % 2) == 1)
        (*inlenb)--;
    inlen = *inlenb / 2;
    inend = in + inlen;
    while ((in < inend) && (out - outstart + 5 < *outlen)) {
        if (xmlLittleEndian) {
	    c= *in++;
	} else {
	    tmp = (unsigned char *) in;
	    c = *tmp++;
	    c = c | (((unsigned int)*tmp) << 8);
	    in++;
	}
        if ((c & 0xFC00) == 0xD800) {    /* surrogates */
	    if (in >= inend) {           /* (in > inend) shouldn't happens */
		break;
	    }
	    if (xmlLittleEndian) {
		d = *in++;
	    } else {
		tmp = (unsigned char *) in;
		d = *tmp++;
		d = d | (((unsigned int)*tmp) << 8);
		in++;
	    }
            if ((d & 0xFC00) == 0xDC00) {
                c &= 0x03FF;
                c <<= 10;
                c |= d & 0x03FF;
                c += 0x10000;
            }
            else {
		*outlen = out - outstart;
		*inlenb = processed - inb;
	        return(-2);
	    }
        }

	/* assertion: c is a single UTF-4 value */
        if (out >= outend)
	    break;
        if      (c <    0x80) {  *out++=  c;                bits= -6; }
        else if (c <   0x800) {  *out++= ((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
        else if (c < 0x10000) {  *out++= ((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
        else                  {  *out++= ((c >> 18) & 0x07) | 0xF0;  bits= 12; }

        for ( ; bits >= 0; bits-= 6) {
            if (out >= outend)
	        break;
            *out++= ((c >> bits) & 0x3F) | 0x80;
        }
	processed = (const unsigned char*) in;
    }
    *outlen = out - outstart;
    *inlenb = processed - inb;
    return(*outlen);
}